

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::processCommandsForCore(CommonCore *this,ActionMessage *cmd)

{
  string_view message;
  string_view message_00;
  bool bVar1;
  int iVar2;
  action_t aVar3;
  action_t aVar4;
  pointer pBVar5;
  ActionMessage *in_RSI;
  CommonCore *in_RDI;
  __sv_type _Var6;
  ActionMessage *in_stack_00000010;
  string debugString;
  json json;
  ActionMessage bye;
  MessageProcessingResult res;
  ActionMessage *in_stack_fffffffffffffd48;
  BrokerBase *in_stack_fffffffffffffd50;
  BrokerBase *in_stack_fffffffffffffd58;
  BrokerBase *__lhs;
  char *in_stack_fffffffffffffd60;
  size_type in_stack_fffffffffffffd68;
  ActionMessage *in_stack_fffffffffffffd70;
  BaseTimeCoordinator *in_stack_fffffffffffffd90;
  ActionMessage *in_stack_fffffffffffffda0;
  ActionMessage *in_stack_fffffffffffffda8;
  CommonCore *in_stack_fffffffffffffdb0;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *in_stack_fffffffffffffdb8;
  anon_class_8_1_ba1d3a4e in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_228;
  GlobalFederateId local_20c;
  __sv_type local_208;
  __sv_type local_1f8;
  BaseType local_1e8;
  GlobalFederateId local_1e4 [9];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_1c0 [6];
  undefined1 in_stack_fffffffffffffeab;
  int in_stack_fffffffffffffeac;
  BrokerBase *in_stack_fffffffffffffeb0;
  string_view in_stack_fffffffffffffeb8;
  GlobalFederateId in_stack_fffffffffffffecc;
  CommonCore *in_stack_ffffffffffffff18;
  GlobalFederateId local_dc [3];
  BaseType local_d0;
  BaseTimeCoordinator *in_stack_ffffffffffffff60;
  GlobalFederateId local_18;
  char local_11;
  CommonCore *pCVar7;
  
  pCVar7 = in_RDI;
  bVar1 = isTimingCommand(in_stack_fffffffffffffd48);
  if (bVar1) {
    if (((in_RDI->super_BrokerBase).enteredExecutionMode & 1U) == 0) {
      pBVar5 = CLI::std::
               unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                             *)0x56fa71);
      aVar4 = (action_t)(in_stack_fffffffffffffd68 >> 0x20);
      (*pBVar5->_vptr_BaseTimeCoordinator[3])();
      pBVar5 = CLI::std::
               unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                             *)0x56fa97);
      memset(&local_18,0,4);
      GlobalFederateId::GlobalFederateId(&local_18);
      iVar2 = (*pBVar5->_vptr_BaseTimeCoordinator[9])(pBVar5,(ulong)(uint)local_18.gid);
      local_11 = (char)iVar2;
      if (local_11 == '\0') {
        (in_RDI->super_BrokerBase).enteredExecutionMode = true;
      }
    }
    else {
      pBVar5 = CLI::std::
               unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                             *)0x56fb03);
      aVar4 = (action_t)(in_stack_fffffffffffffd68 >> 0x20);
      iVar2 = (*pBVar5->_vptr_BaseTimeCoordinator[3])(pBVar5,in_RSI);
      if ((char)iVar2 != '\0') {
        pBVar5 = CLI::std::
                 unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               *)0x56fb2d);
        (*pBVar5->_vptr_BaseTimeCoordinator[2])();
      }
    }
    bVar1 = isDisconnectCommand((ActionMessage *)in_stack_fffffffffffffd58);
    if (bVar1) {
      aVar3 = ActionMessage::action(in_RSI);
      if ((aVar3 == cmd_disconnect) &&
         (bVar1 = GlobalFederateId::operator==
                            (&in_RSI->source_id,
                             (GlobalBrokerId)(in_RDI->super_BrokerBase).higher_broker_id.gid), bVar1
         )) {
        BrokerBase::setBrokerState
                  (in_stack_fffffffffffffd58,(BrokerState)((ulong)in_stack_fffffffffffffd50 >> 0x30)
                  );
        if ((((in_RDI->super_BrokerBase).hasTimeDependency & 1U) != 0) ||
           (((in_RDI->super_BrokerBase).hasFilters & 1U) != 0)) {
          CLI::std::
          unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
          ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                        *)0x56fbd8);
          BaseTimeCoordinator::disconnect(in_stack_ffffffffffffff60);
        }
        ActionMessage::ActionMessage(in_stack_fffffffffffffd70,aVar4);
        GlobalFederateId::GlobalFederateId(local_dc,(GlobalBrokerId)0x0);
        local_d0 = local_dc[0].gid;
        gmlc::containers::
        DualStringMappedVector<helics::FedInfo,helics::GlobalFederateId,(reference_stability)0,5>::
        apply<helics::CommonCore::processCommandsForCore(helics::ActionMessage_const&)::__0>
                  (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0);
        ActionMessage::ActionMessage((ActionMessage *)&in_RDI->super_BrokerBase,aVar4);
        BrokerBase::addActionMessage(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffd50);
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffd50);
      }
      else {
        checkAndProcessDisconnect(in_stack_ffffffffffffff18);
      }
    }
  }
  else {
    bVar1 = isDependencyCommand(in_stack_fffffffffffffd48);
    if (bVar1) {
      CLI::std::
      unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
      operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                  *)0x56fd20);
      BaseTimeCoordinator::processDependencyUpdateMessage
                (in_stack_fffffffffffffd90,(ActionMessage *)in_RDI);
    }
    else {
      aVar4 = ActionMessage::action(in_RSI);
      if ((aVar4 == cmd_time_block) ||
         (aVar4 = ActionMessage::action(in_RSI), aVar4 == cmd_time_unblock)) {
        manageTimeBlocks(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      }
      else {
        aVar4 = ActionMessage::action(in_RSI);
        if (aVar4 == cmd_grant_timeout_check) {
          CLI::std::
          unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
          ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                        *)0x56fd9d);
          BaseTimeCoordinator::grantTimeoutCheck_abi_cxx11_
                    ((BaseTimeCoordinator *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
          bVar1 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::is_null(local_1c0);
          if (!bVar1) {
            fileops::generateJsonString
                      ((json *)in_stack_fffffffffffffd58,
                       SUB81((ulong)in_stack_fffffffffffffd50 >> 0x38,0));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60
                      );
            local_1e8 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
            GlobalFederateId::GlobalFederateId(local_1e4,(GlobalBrokerId)local_1e8);
            getIdentifier_abi_cxx11_(in_RDI);
            local_1f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffd50);
            local_208 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffd50);
            message._M_str = (char *)pCVar7;
            message._M_len = (size_t)in_RSI;
            in_stack_fffffffffffffd50 = (BrokerBase *)local_208._M_str;
            BrokerBase::sendToLogger
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffecc,in_stack_fffffffffffffeac
                       ,in_stack_fffffffffffffeb8,message,(bool)in_stack_fffffffffffffeab);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd50);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffffd50);
        }
        else {
          __lhs = &in_RDI->super_BrokerBase;
          GlobalFederateId::GlobalFederateId
                    (&local_20c,
                     (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
          getIdentifier_abi_cxx11_(in_RDI);
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd50);
          prettyPrintString_abi_cxx11_(in_stack_00000010);
          std::operator+((char *)__lhs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffd50);
          _Var6 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffd50);
          pbStack_228 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        _Var6._M_str;
          message_00._M_str = (char *)pCVar7;
          message_00._M_len = (size_t)in_RSI;
          BrokerBase::sendToLogger
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffecc,in_stack_fffffffffffffeac,
                     in_stack_fffffffffffffeb8,message_00,(bool)in_stack_fffffffffffffeab);
          std::__cxx11::string::~string(pbStack_228);
          std::__cxx11::string::~string(pbStack_228);
        }
      }
    }
  }
  return;
}

Assistant:

void CommonCore::processCommandsForCore(const ActionMessage& cmd)
{
    if (isTimingCommand(cmd)) {
        if (!enteredExecutionMode) {
            timeCoord->processTimeMessage(cmd);
            auto res = timeCoord->checkExecEntry();
            if (res == MessageProcessingResult::NEXT_STEP) {
                enteredExecutionMode = true;
            }
        } else {
            if (timeCoord->processTimeMessage(cmd) != TimeProcessingResult::NOT_PROCESSED) {
                timeCoord->updateTimeFactors();
            }
        }
        if (isDisconnectCommand(cmd)) {
            if ((cmd.action() == CMD_DISCONNECT) && (cmd.source_id == higher_broker_id)) {
                setBrokerState(BrokerState::TERMINATING);
                if (hasTimeDependency || hasFilters) {
                    timeCoord->disconnect();
                }
                ActionMessage bye(CMD_DISCONNECT_FED_ACK);
                bye.source_id = parent_broker_id;
                loopFederates.apply([&bye](auto& fed) {
                    auto state = fed->getState();
                    if ((FederateStates::FINISHED == state) || (FederateStates::ERRORED == state)) {
                        return;
                    }
                    bye.dest_id = fed->global_id.load();
                    fed->addAction(bye);
                });

                addActionMessage(CMD_STOP);
            } else {
                checkAndProcessDisconnect();
            }
        }
    } else if (isDependencyCommand(cmd)) {
        timeCoord->processDependencyUpdateMessage(cmd);
    } else if (cmd.action() == CMD_TIME_BLOCK || cmd.action() == CMD_TIME_UNBLOCK) {
        manageTimeBlocks(cmd);
    } else if (cmd.action() == CMD_GRANT_TIMEOUT_CHECK) {
        auto json = timeCoord->grantTimeoutCheck(cmd);
        if (!json.is_null()) {
            auto debugString = fileops::generateJsonString(json);
            debugString.insert(0, "TIME DEBUGGING::");
            LOG_WARNING(global_broker_id_local, getIdentifier(), debugString);
        }
    } else {
        LOG_WARNING(global_broker_id_local,
                    getIdentifier(),
                    "dropping message:" + prettyPrintString(cmd));
    }
}